

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

int png_image_read_colormap(png_voidp argument)

{
  undefined8 *puVar1;
  png_const_structrp png_ptr_00;
  png_colorp ppVar2;
  bool bVar3;
  png_uint_16 pVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  png_uint_32 pVar8;
  png_uint_32 pVar9;
  png_uint_32 pVar10;
  png_uint_32 blue;
  png_uint_32 local_16c;
  png_uint_32 local_14c;
  png_bytep local_128;
  uint local_100;
  uint i_2;
  int do_background;
  png_const_colorp colormap;
  png_const_bytep trans_1;
  uint num_trans;
  undefined2 local_dc;
  png_color_16 c_3;
  png_uint_32 b_1;
  png_uint_32 g_2;
  png_uint_32 r_1;
  uint sample_size;
  png_uint_32 b;
  png_uint_32 g_1;
  png_uint_32 r;
  png_uint_32 gray_4;
  undefined1 local_b0 [2];
  png_color_16 c_2;
  png_uint_32 gray_3;
  png_uint_32 back_bx;
  png_uint_32 back_gx;
  png_uint_32 back_rx;
  png_uint_32 alpha;
  uint g;
  png_uint_32 gray_2;
  png_uint_32 a;
  png_uint_32 i_1;
  png_uint_32 gray_1;
  undefined1 local_7c [2];
  png_color_16 c_1;
  png_uint_32 gray;
  png_color_16 c;
  uint back_alpha_1;
  uint back_alpha;
  uint trans;
  uint val;
  uint i;
  uint step;
  int expand_tRNS;
  png_uint_32 back_b;
  png_uint_32 back_g;
  png_uint_32 back_r;
  uint background_index;
  uint data_encoding;
  uint output_processing;
  uint cmap_entries;
  int output_encoding;
  png_uint_32 output_format;
  png_structrp png_ptr;
  png_imagep image;
  png_image_read_control *display;
  png_voidp argument_local;
  
  puVar1 = *argument;
  png_ptr_00 = *(png_const_structrp *)*puVar1;
  uVar7 = *(uint *)((long)puVar1 + 0x14);
  iVar5 = 1;
  if ((uVar7 & 4) != 0) {
    iVar5 = 2;
  }
  back_g = 0x100;
  bVar3 = false;
  if ((((png_ptr_00->color_type & 4) == 0) && (png_ptr_00->num_trans == 0)) || ((uVar7 & 1) != 0)) {
    if (iVar5 == 2) {
      expand_tRNS = 0xffff;
      back_b = 0xffff;
      step = 0xffff;
    }
    else {
      expand_tRNS = 0xff;
      back_b = 0xff;
      step = 0xff;
    }
  }
  else if (iVar5 == 2) {
    back_b = 0;
    expand_tRNS = 0;
    step = 0;
  }
  else {
    if (*(long *)((long)argument + 0x20) == 0) {
      png_error(png_ptr_00,"background color must be supplied to remove alpha/transparency");
    }
    expand_tRNS = (int)*(byte *)(*(long *)((long)argument + 0x20) + 1);
    step = expand_tRNS;
    back_b = expand_tRNS;
    if ((uVar7 & 2) != 0) {
      back_b = (png_uint_32)**(byte **)((long)argument + 0x20);
      step = (uint)*(byte *)(*(long *)((long)argument + 0x20) + 2);
    }
  }
  if (((png_ptr_00->colorspace).flags & 1) == 0) {
    if ((png_ptr_00->bit_depth == '\x10') && ((*(uint *)(puVar1 + 3) & 4) == 0)) {
      (png_ptr_00->colorspace).gamma = 100000;
    }
    else {
      (png_ptr_00->colorspace).gamma = 0xb18f;
    }
    (png_ptr_00->colorspace).flags = (png_ptr_00->colorspace).flags | 1;
  }
  switch(png_ptr_00->color_type) {
  case '\0':
    if (png_ptr_00->bit_depth < 9) {
      back_alpha_1 = 0x100;
      c.blue = 0;
      c.gray = 0;
      data_encoding = 1 << (png_ptr_00->bit_depth & 0x1f);
      if (*(uint *)((long)puVar1 + 0x1c) < data_encoding) {
        png_error(png_ptr_00,"gray[8] color-map: too few entries");
      }
      background_index = 0;
      if (((png_ptr_00->num_trans != 0) &&
          (back_alpha_1 = (uint)(png_ptr_00->trans_color).gray, (uVar7 & 1) == 0)) &&
         (c.blue = 0xff, c.gray = 0, iVar5 == 2)) {
        c.blue = 0xffff;
        c.gray = 0;
      }
      back_alpha = 0;
      for (trans = 0; trans < data_encoding; trans = trans + 1) {
        if (trans == back_alpha_1) {
          png_create_colormap_entry
                    ((png_image_read_control *)argument,trans,back_b,expand_tRNS,step,c._6_4_,iVar5)
          ;
        }
        else {
          png_create_colormap_entry
                    ((png_image_read_control *)argument,trans,back_alpha,back_alpha,back_alpha,0xff,
                     3);
        }
        back_alpha = (int)(0xff / (ulong)(data_encoding - 1)) + back_alpha;
      }
      back_r = 3;
      if (png_ptr_00->bit_depth < 8) {
        png_set_packing(png_ptr_00);
      }
    }
    else {
      back_r = 1;
      if (*(uint *)((long)puVar1 + 0x1c) < 0x100) {
        png_error(png_ptr_00,"gray[16] color-map: too few entries");
      }
      data_encoding = make_gray_colormap((png_image_read_control *)argument);
      if (png_ptr_00->num_trans == 0) {
        background_index = 0;
      }
      else {
        if ((uVar7 & 1) == 0) {
          if ((back_b == expand_tRNS) && (expand_tRNS == step)) {
            c_1.red = (undefined2)expand_tRNS;
            c_1.green = expand_tRNS._2_2_;
            if (iVar5 == 2) {
              c_1._2_4_ = (uint)png_sRGB_base[(uint)(expand_tRNS * 0xff) >> 0xf] +
                          ((expand_tRNS * 0xff & 0x7fffU) *
                           (uint)png_sRGB_delta[(uint)(expand_tRNS * 0xff) >> 0xf] >> 0xc) >> 8 &
                          0xff;
              png_create_colormap_entry
                        ((png_image_read_control *)argument,c_1._2_4_,expand_tRNS,expand_tRNS,
                         expand_tRNS,0xffff,2);
            }
            c_1.gray._0_1_ = 0;
            png_set_background_fixed(png_ptr_00,(png_const_color_16p)&c_1.gray,1,0,0);
            background_index = 0;
            break;
          }
          c.red = 0xff;
          c.green = 0;
          if (iVar5 == 2) {
            c.red = 0xffff;
            c.green = 0;
          }
        }
        else {
          c.red = 0;
          c.green = 0;
        }
        bVar3 = true;
        background_index = 2;
        back_g = 0xfe;
        png_create_colormap_entry
                  ((png_image_read_control *)argument,0xfe,back_b,expand_tRNS,step,c._2_4_,iVar5);
      }
    }
    break;
  default:
    png_error(png_ptr_00,"invalid PNG color type");
  case '\x02':
  case '\x06':
    if ((uVar7 & 2) == 0) {
      png_set_rgb_to_gray_fixed(png_ptr_00,1,-1,-1);
      back_r = 1;
      if (((png_ptr_00->color_type == '\x06') || (png_ptr_00->num_trans != 0)) && ((uVar7 & 1) != 0)
         ) {
        bVar3 = true;
        if (*(uint *)((long)puVar1 + 0x1c) < 0x100) {
          png_error(png_ptr_00,"rgb[ga] color-map: too few entries");
        }
        data_encoding = make_ga_colormap((png_image_read_control *)argument);
        back_g = 0xe7;
        background_index = 1;
      }
      else {
        if (*(uint *)((long)puVar1 + 0x1c) < 0x100) {
          png_error(png_ptr_00,"rgb[gray] color-map: too few entries");
        }
        if (((png_ptr_00->color_type == '\x06') || (png_ptr_00->num_trans != 0)) &&
           (iVar6 = png_gamma_not_sRGB((png_ptr_00->colorspace).gamma), iVar6 != 0)) {
          data_encoding = make_gray_file_colormap((png_image_read_control *)argument);
          back_r = 3;
        }
        else {
          data_encoding = make_gray_colormap((png_image_read_control *)argument);
        }
        if ((png_ptr_00->color_type == '\x06') || (png_ptr_00->num_trans != 0)) {
          g_1 = expand_tRNS;
          if (back_r == 3) {
            if (iVar5 == 1) {
              g_1 = (png_uint_32)png_sRGB_table[(uint)expand_tRNS];
            }
            pVar4 = png_gamma_16bit_correct(g_1,(png_ptr_00->colorspace).gamma);
            g_1 = (uint)pVar4 * 0xff + 0x807f >> 0x10;
            png_create_colormap_entry
                      ((png_image_read_control *)argument,g_1,expand_tRNS,expand_tRNS,expand_tRNS,0,
                       iVar5);
          }
          else if (iVar5 == 2) {
            g_1 = (uint)png_sRGB_base[(uint)(expand_tRNS * 0xff) >> 0xf] +
                  ((expand_tRNS * 0xff & 0x7fffU) *
                   (uint)png_sRGB_delta[(uint)(expand_tRNS * 0xff) >> 0xf] >> 0xc) >> 8 & 0xff;
            png_create_colormap_entry
                      ((png_image_read_control *)argument,g_1,expand_tRNS,expand_tRNS,expand_tRNS,0,
                       2);
          }
          r._2_1_ = 0;
          gray_4._0_2_ = (undefined2)g_1;
          bVar3 = true;
          gray_4._2_2_ = (undefined2)gray_4;
          local_b0 = (undefined1  [2])(undefined2)gray_4;
          c_2._0_2_ = (undefined2)gray_4;
          png_set_background_fixed(png_ptr_00,(png_const_color_16p)((long)&r + 2),1,0,0);
        }
        background_index = 0;
      }
    }
    else {
      back_r = 1;
      if ((png_ptr_00->color_type == '\x06') || (png_ptr_00->num_trans != 0)) {
        if ((uVar7 & 1) == 0) {
          uVar7 = ((uVar7 & 3) + 1) * (((uVar7 & 4) >> 2) + 1);
          if (*(uint *)((long)puVar1 + 0x1c) < 0xf4) {
            png_error(png_ptr_00,"rgb-alpha color-map: too few entries");
          }
          pVar8 = make_rgb_colormap((png_image_read_control *)argument);
          png_create_colormap_entry
                    ((png_image_read_control *)argument,pVar8,back_b,expand_tRNS,step,0,iVar5);
          if (iVar5 == 2) {
            b_1 = (uint)png_sRGB_base[back_b * 0xff >> 0xf] +
                  ((back_b * 0xff & 0x7fff) * (uint)png_sRGB_delta[back_b * 0xff >> 0xf] >> 0xc) >>
                  8 & 0xff;
            c_3._6_4_ = (uint)png_sRGB_base[(uint)(expand_tRNS * 0xff) >> 0xf] +
                        ((expand_tRNS * 0xff & 0x7fffU) *
                         (uint)png_sRGB_delta[(uint)(expand_tRNS * 0xff) >> 0xf] >> 0xc) >> 8 & 0xff
            ;
            c_3._2_4_ = (uint)png_sRGB_base[step * 0xff >> 0xf] +
                        ((step * 0xff & 0x7fff) * (uint)png_sRGB_delta[step * 0xff >> 0xf] >> 0xc)
                        >> 8 & 0xff;
          }
          else {
            b_1 = back_b;
            c_3.blue = (undefined2)expand_tRNS;
            c_3.gray = expand_tRNS._2_2_;
            c_3.red = (undefined2)expand_tRNS;
            c_3.green = expand_tRNS._2_2_;
          }
          iVar6 = memcmp((void *)(*(long *)((long)argument + 0x18) + (ulong)(uVar7 * pVar8)),
                         (void *)(*(long *)((long)argument + 0x18) +
                                 (ulong)(uVar7 * (((b_1 * 5 + 0x82 >> 8) * 6 +
                                                  (c_3._6_4_ * 5 + 0x82U >> 8)) * 6 +
                                                  (c_3._2_4_ * 5 + 0x82U >> 8) & 0xff))),
                         (ulong)uVar7);
          if (iVar6 == 0) {
            trans_1._6_1_ = 0;
            num_trans._0_2_ = (undefined2)back_b;
            num_trans._2_2_ = (undefined2)expand_tRNS;
            local_dc = (undefined2)step;
            c_3._0_2_ = num_trans._2_2_;
            png_set_background_fixed(png_ptr_00,(png_const_color_16p)((long)&trans_1 + 6),1,0,0);
            background_index = 3;
            data_encoding = pVar8;
          }
          else {
            data_encoding = pVar8 + 1;
            for (b_1 = 0; b_1 < 0x100; b_1 = b_1 << 1 | 0x7f) {
              c_3.blue = 0;
              c_3.gray = 0;
              for (; (uint)c_3._6_4_ < 0x100; c_3._6_4_ = c_3._6_4_ << 1 | 0x7f) {
                c_3.red = 0;
                c_3.green = 0;
                for (; (uint)c_3._2_4_ < 0x100; c_3._2_4_ = c_3._2_4_ << 1 | 0x7f) {
                  pVar9 = png_colormap_compose
                                    ((png_image_read_control *)argument,b_1,1,0x80,back_b,iVar5);
                  pVar10 = png_colormap_compose
                                     ((png_image_read_control *)argument,c_3._6_4_,1,0x80,
                                      expand_tRNS,iVar5);
                  blue = png_colormap_compose
                                   ((png_image_read_control *)argument,c_3._2_4_,1,0x80,step,iVar5);
                  png_create_colormap_entry
                            ((png_image_read_control *)argument,data_encoding,pVar9,pVar10,blue,0,
                             iVar5);
                  data_encoding = data_encoding + 1;
                }
              }
            }
            bVar3 = true;
            background_index = 4;
            back_g = pVar8;
          }
        }
        else {
          if (*(uint *)((long)puVar1 + 0x1c) < 0xf4) {
            png_error(png_ptr_00,"rgb+alpha color-map: too few entries");
          }
          back_g = make_rgb_colormap((png_image_read_control *)argument);
          png_create_colormap_entry((png_image_read_control *)argument,back_g,0xff,0xff,0xff,0,1);
          data_encoding = back_g + 1;
          for (b = 0; b < 0x100; b = b << 1 | 0x7f) {
            for (sample_size = 0; sample_size < 0x100; sample_size = sample_size << 1 | 0x7f) {
              for (r_1 = 0; r_1 < 0x100; r_1 = r_1 << 1 | 0x7f) {
                png_create_colormap_entry
                          ((png_image_read_control *)argument,data_encoding,b,sample_size,r_1,0x80,1
                          );
                data_encoding = data_encoding + 1;
              }
            }
          }
          bVar3 = true;
          background_index = 4;
        }
      }
      else {
        if (*(uint *)((long)puVar1 + 0x1c) < 0xd8) {
          png_error(png_ptr_00,"rgb color-map: too few entries");
        }
        data_encoding = make_rgb_colormap((png_image_read_control *)argument);
        background_index = 3;
      }
    }
    break;
  case '\x03':
    trans_1._0_4_ = (uint)png_ptr_00->num_trans;
    if ((uint)trans_1 == 0) {
      local_128 = (png_bytep)0x0;
    }
    else {
      local_128 = png_ptr_00->trans_alpha;
    }
    ppVar2 = png_ptr_00->palette;
    if (local_128 == (png_bytep)0x0) {
      trans_1._0_4_ = 0;
    }
    background_index = 0;
    back_r = 3;
    data_encoding = (uint)png_ptr_00->num_palette;
    if (0x100 < data_encoding) {
      data_encoding = 0x100;
    }
    if (*(uint *)((long)puVar1 + 0x1c) < data_encoding) {
      png_error(png_ptr_00,"palette color-map: too few entries");
    }
    for (local_100 = 0; local_100 < data_encoding; local_100 = local_100 + 1) {
      if (((local_128 == (png_bytep)0x0 || (uVar7 & 1) != 0) || ((uint)trans_1 <= local_100)) ||
         (0xfe < local_128[local_100])) {
        if (local_100 < (uint)trans_1) {
          local_16c = (png_uint_32)local_128[local_100];
        }
        else {
          local_16c = 0xff;
        }
        png_create_colormap_entry
                  ((png_image_read_control *)argument,local_100,(uint)ppVar2[local_100].red,
                   (uint)ppVar2[local_100].green,(uint)ppVar2[local_100].blue,local_16c,3);
      }
      else if (local_128[local_100] == '\0') {
        png_create_colormap_entry
                  ((png_image_read_control *)argument,local_100,back_b,expand_tRNS,step,0,iVar5);
      }
      else {
        pVar8 = png_colormap_compose
                          ((png_image_read_control *)argument,(uint)ppVar2[local_100].red,3,
                           (uint)local_128[local_100],back_b,iVar5);
        pVar9 = png_colormap_compose
                          ((png_image_read_control *)argument,(uint)ppVar2[local_100].green,3,
                           (uint)local_128[local_100],expand_tRNS,iVar5);
        pVar10 = png_colormap_compose
                           ((png_image_read_control *)argument,(uint)ppVar2[local_100].blue,3,
                            (uint)local_128[local_100],step,iVar5);
        if (iVar5 == 2) {
          local_14c = (uint)local_128[local_100] * 0x101;
        }
        else {
          local_14c = (png_uint_32)local_128[local_100];
        }
        png_create_colormap_entry
                  ((png_image_read_control *)argument,local_100,pVar8,pVar9,pVar10,local_14c,iVar5);
      }
    }
    if (png_ptr_00->bit_depth < 8) {
      png_set_packing(png_ptr_00);
    }
    break;
  case '\x04':
    back_r = 1;
    if ((uVar7 & 1) == 0) {
      if (((uVar7 & 2) == 0) || ((back_b == expand_tRNS && (expand_tRNS == step)))) {
        a = expand_tRNS;
        if (*(uint *)((long)puVar1 + 0x1c) < 0x100) {
          png_error(png_ptr_00,"gray-alpha color-map: too few entries");
        }
        data_encoding = make_gray_colormap((png_image_read_control *)argument);
        if (iVar5 == 2) {
          a = (uint)png_sRGB_base[(uint)(expand_tRNS * 0xff) >> 0xf] +
              ((expand_tRNS * 0xff & 0x7fffU) *
               (uint)png_sRGB_delta[(uint)(expand_tRNS * 0xff) >> 0xf] >> 0xc) >> 8 & 0xff;
          png_create_colormap_entry
                    ((png_image_read_control *)argument,a,expand_tRNS,expand_tRNS,expand_tRNS,0xffff
                     ,2);
        }
        i_1._2_1_ = 0;
        gray_1._0_2_ = (undefined2)a;
        gray_1._2_2_ = (undefined2)gray_1;
        local_7c = (undefined1  [2])(undefined2)gray_1;
        c_1._0_2_ = (undefined2)gray_1;
        png_set_background_fixed(png_ptr_00,(png_const_color_16p)((long)&i_1 + 2),1,0,0);
        background_index = 0;
      }
      else {
        if (*(uint *)((long)puVar1 + 0x1c) < 0x100) {
          png_error(png_ptr_00,"ga-alpha color-map: too few entries");
        }
        gray_2 = 0;
        while (gray_2 < 0xe7) {
          uVar7 = (gray_2 * 0x100 + 0x73) / 0xe7;
          png_create_colormap_entry
                    ((png_image_read_control *)argument,gray_2,uVar7,uVar7,uVar7,0xff,1);
          gray_2 = gray_2 + 1;
        }
        back_g = gray_2;
        pVar8 = 0xff;
        if (iVar5 == 2) {
          pVar8 = 0xffff;
        }
        png_create_colormap_entry
                  ((png_image_read_control *)argument,gray_2,back_b,expand_tRNS,step,pVar8,iVar5);
        if (iVar5 == 1) {
          back_b = (png_uint_32)png_sRGB_table[back_b];
          expand_tRNS = (int)png_sRGB_table[(uint)expand_tRNS];
          step = (uint)png_sRGB_table[step];
        }
        gray_2 = gray_2 + 1;
        for (g = 1; g < 5; g = g + 1) {
          iVar5 = (g * -0x33 + 0xff) * back_b;
          iVar6 = (g * -0x33 + 0xff) * expand_tRNS;
          c_2._6_4_ = (g * -0x33 + 0xff) * step;
          for (back_rx = 0; back_rx < 6; back_rx = back_rx + 1) {
            c_2._2_4_ = (uint)png_sRGB_table[back_rx * 0x33] * g * 0x33;
            png_create_colormap_entry
                      ((png_image_read_control *)argument,gray_2,
                       (uint)png_sRGB_base[(uint)(c_2._2_4_ + iVar5) >> 0xf] +
                       ((c_2._2_4_ + iVar5 & 0x7fffU) *
                        (uint)png_sRGB_delta[(uint)(c_2._2_4_ + iVar5) >> 0xf] >> 0xc) >> 8 & 0xff,
                       (uint)png_sRGB_base[(uint)(c_2._2_4_ + iVar6) >> 0xf] +
                       ((c_2._2_4_ + iVar6 & 0x7fffU) *
                        (uint)png_sRGB_delta[(uint)(c_2._2_4_ + iVar6) >> 0xf] >> 0xc) >> 8 & 0xff,
                       (uint)png_sRGB_base[(uint)(c_2._2_4_ + c_2._6_4_) >> 0xf] +
                       ((c_2._2_4_ + c_2._6_4_ & 0x7fff) *
                        (uint)png_sRGB_delta[(uint)(c_2._2_4_ + c_2._6_4_) >> 0xf] >> 0xc) >> 8 &
                       0xff,0xff,1);
            gray_2 = gray_2 + 1;
          }
        }
        data_encoding = gray_2;
        background_index = 1;
      }
    }
    else {
      if (*(uint *)((long)puVar1 + 0x1c) < 0x100) {
        png_error(png_ptr_00,"gray+alpha color-map: too few entries");
      }
      data_encoding = make_ga_colormap((png_image_read_control *)argument);
      back_g = 0xe7;
      background_index = 1;
    }
  }
  if (((bVar3) && (png_ptr_00->num_trans != 0)) && ((png_ptr_00->color_type & 4) == 0)) {
    png_set_tRNS_to_alpha(png_ptr_00);
  }
  if (back_r == 1) {
    png_set_alpha_mode_fixed(png_ptr_00,0,220000);
  }
  else if (back_r != 3) {
    png_error(png_ptr_00,"bad data option (internal error)");
  }
  if (8 < png_ptr_00->bit_depth) {
    png_set_scale_16(png_ptr_00);
  }
  if ((0x100 < data_encoding) || (*(uint *)((long)puVar1 + 0x1c) < data_encoding)) {
    png_error(png_ptr_00,"color map overflow (BAD internal error)");
  }
  *(uint *)((long)puVar1 + 0x1c) = data_encoding;
  switch(background_index) {
  case 0:
    break;
  case 1:
    if (back_g != 0xe7) goto LAB_001159b7;
    goto LAB_001159c7;
  case 2:
    if ((back_g < data_encoding) && (back_g == 0xfe)) goto LAB_001159c7;
    goto LAB_001159b7;
  case 3:
    break;
  case 4:
    if (back_g == 0xd8) goto LAB_001159c7;
    goto LAB_001159b7;
  default:
    png_error(png_ptr_00,"bad processing option (internal error)");
  }
  if (back_g == 0x100) {
LAB_001159c7:
    *(uint *)((long)argument + 0x48) = background_index;
    return 1;
  }
LAB_001159b7:
  png_error(png_ptr_00,"bad background index (internal error)");
}

Assistant:

static int
png_image_read_colormap(png_voidp argument)
{
   png_image_read_control *display =
      png_voidcast(png_image_read_control*, argument);
   png_imagep image = display->image;

   png_structrp png_ptr = image->opaque->png_ptr;
   png_uint_32 output_format = image->format;
   int output_encoding = (output_format & PNG_FORMAT_FLAG_LINEAR) != 0 ?
      P_LINEAR : P_sRGB;

   unsigned int cmap_entries;
   unsigned int output_processing;        /* Output processing option */
   unsigned int data_encoding = P_NOTSET; /* Encoding libpng must produce */

   /* Background information; the background color and the index of this color
    * in the color-map if it exists (else 256).
    */
   unsigned int background_index = 256;
   png_uint_32 back_r, back_g, back_b;

   /* Flags to accumulate things that need to be done to the input. */
   int expand_tRNS = 0;

   /* Exclude the NYI feature of compositing onto a color-mapped buffer; it is
    * very difficult to do, the results look awful, and it is difficult to see
    * what possible use it is because the application can't control the
    * color-map.
    */
   if (((png_ptr->color_type & PNG_COLOR_MASK_ALPHA) != 0 ||
         png_ptr->num_trans > 0) /* alpha in input */ &&
      ((output_format & PNG_FORMAT_FLAG_ALPHA) == 0) /* no alpha in output */)
   {
      if (output_encoding == P_LINEAR) /* compose on black */
         back_b = back_g = back_r = 0;

      else if (display->background == NULL /* no way to remove it */)
         png_error(png_ptr,
             "background color must be supplied to remove alpha/transparency");

      /* Get a copy of the background color (this avoids repeating the checks
       * below.)  The encoding is 8-bit sRGB or 16-bit linear, depending on the
       * output format.
       */
      else
      {
         back_g = display->background->green;
         if ((output_format & PNG_FORMAT_FLAG_COLOR) != 0)
         {
            back_r = display->background->red;
            back_b = display->background->blue;
         }
         else
            back_b = back_r = back_g;
      }
   }

   else if (output_encoding == P_LINEAR)
      back_b = back_r = back_g = 65535;

   else
      back_b = back_r = back_g = 255;

   /* Default the input file gamma if required - this is necessary because
    * libpng assumes that if no gamma information is present the data is in the
    * output format, but the simplified API deduces the gamma from the input
    * format.
    */
   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_GAMMA) == 0)
   {
      /* Do this directly, not using the png_colorspace functions, to ensure
       * that it happens even if the colorspace is invalid (though probably if
       * it is the setting will be ignored)  Note that the same thing can be
       * achieved at the application interface with png_set_gAMA.
       */
      if (png_ptr->bit_depth == 16 &&
         (image->flags & PNG_IMAGE_FLAG_16BIT_sRGB) == 0)
         png_ptr->colorspace.gamma = PNG_GAMMA_LINEAR;

      else
         png_ptr->colorspace.gamma = PNG_GAMMA_sRGB_INVERSE;

      png_ptr->colorspace.flags |= PNG_COLORSPACE_HAVE_GAMMA;
   }

   /* Decide what to do based on the PNG color type of the input data.  The
    * utility function png_create_colormap_entry deals with most aspects of the
    * output transformations; this code works out how to produce bytes of
    * color-map entries from the original format.
    */
   switch (png_ptr->color_type)
   {
      case PNG_COLOR_TYPE_GRAY:
         if (png_ptr->bit_depth <= 8)
         {
            /* There at most 256 colors in the output, regardless of
             * transparency.
             */
            unsigned int step, i, val, trans = 256/*ignore*/, back_alpha = 0;

            cmap_entries = 1U << png_ptr->bit_depth;
            if (cmap_entries > image->colormap_entries)
               png_error(png_ptr, "gray[8] color-map: too few entries");

            step = 255 / (cmap_entries - 1);
            output_processing = PNG_CMAP_NONE;

            /* If there is a tRNS chunk then this either selects a transparent
             * value or, if the output has no alpha, the background color.
             */
            if (png_ptr->num_trans > 0)
            {
               trans = png_ptr->trans_color.gray;

               if ((output_format & PNG_FORMAT_FLAG_ALPHA) == 0)
                  back_alpha = output_encoding == P_LINEAR ? 65535 : 255;
            }

            /* png_create_colormap_entry just takes an RGBA and writes the
             * corresponding color-map entry using the format from 'image',
             * including the required conversion to sRGB or linear as
             * appropriate.  The input values are always either sRGB (if the
             * gamma correction flag is 0) or 0..255 scaled file encoded values
             * (if the function must gamma correct them).
             */
            for (i=val=0; i<cmap_entries; ++i, val += step)
            {
               /* 'i' is a file value.  While this will result in duplicated
                * entries for 8-bit non-sRGB encoded files it is necessary to
                * have non-gamma corrected values to do tRNS handling.
                */
               if (i != trans)
                  png_create_colormap_entry(display, i, val, val, val, 255,
                      P_FILE/*8-bit with file gamma*/);

               /* Else this entry is transparent.  The colors don't matter if
                * there is an alpha channel (back_alpha == 0), but it does no
                * harm to pass them in; the values are not set above so this
                * passes in white.
                *
                * NOTE: this preserves the full precision of the application
                * supplied background color when it is used.
                */
               else
                  png_create_colormap_entry(display, i, back_r, back_g, back_b,
                      back_alpha, output_encoding);
            }

            /* We need libpng to preserve the original encoding. */
            data_encoding = P_FILE;

            /* The rows from libpng, while technically gray values, are now also
             * color-map indices; however, they may need to be expanded to 1
             * byte per pixel.  This is what png_set_packing does (i.e., it
             * unpacks the bit values into bytes.)
             */
            if (png_ptr->bit_depth < 8)
               png_set_packing(png_ptr);
         }

         else /* bit depth is 16 */
         {
            /* The 16-bit input values can be converted directly to 8-bit gamma
             * encoded values; however, if a tRNS chunk is present 257 color-map
             * entries are required.  This means that the extra entry requires
             * special processing; add an alpha channel, sacrifice gray level
             * 254 and convert transparent (alpha==0) entries to that.
             *
             * Use libpng to chop the data to 8 bits.  Convert it to sRGB at the
             * same time to minimize quality loss.  If a tRNS chunk is present
             * this means libpng must handle it too; otherwise it is impossible
             * to do the exact match on the 16-bit value.
             *
             * If the output has no alpha channel *and* the background color is
             * gray then it is possible to let libpng handle the substitution by
             * ensuring that the corresponding gray level matches the background
             * color exactly.
             */
            data_encoding = P_sRGB;

            if (PNG_GRAY_COLORMAP_ENTRIES > image->colormap_entries)
               png_error(png_ptr, "gray[16] color-map: too few entries");

            cmap_entries = (unsigned int)make_gray_colormap(display);

            if (png_ptr->num_trans > 0)
            {
               unsigned int back_alpha;

               if ((output_format & PNG_FORMAT_FLAG_ALPHA) != 0)
                  back_alpha = 0;

               else
               {
                  if (back_r == back_g && back_g == back_b)
                  {
                     /* Background is gray; no special processing will be
                      * required.
                      */
                     png_color_16 c;
                     png_uint_32 gray = back_g;

                     if (output_encoding == P_LINEAR)
                     {
                        gray = PNG_sRGB_FROM_LINEAR(gray * 255);

                        /* And make sure the corresponding palette entry
                         * matches.
                         */
                        png_create_colormap_entry(display, gray, back_g, back_g,
                            back_g, 65535, P_LINEAR);
                     }

                     /* The background passed to libpng, however, must be the
                      * sRGB value.
                      */
                     c.index = 0; /*unused*/
                     c.gray = c.red = c.green = c.blue = (png_uint_16)gray;

                     /* NOTE: does this work without expanding tRNS to alpha?
                      * It should be the color->gray case below apparently
                      * doesn't.
                      */
                     png_set_background_fixed(png_ptr, &c,
                         PNG_BACKGROUND_GAMMA_SCREEN, 0/*need_expand*/,
                         0/*gamma: not used*/);

                     output_processing = PNG_CMAP_NONE;
                     break;
                  }
#ifdef __COVERITY__
                 /* Coverity claims that output_encoding cannot be 2 (P_LINEAR)
                  * here.
                  */
                  back_alpha = 255;
#else
                  back_alpha = output_encoding == P_LINEAR ? 65535 : 255;
#endif
               }

               /* output_processing means that the libpng-processed row will be
                * 8-bit GA and it has to be processing to single byte color-map
                * values.  Entry 254 is replaced by either a completely
                * transparent entry or by the background color at full
                * precision (and the background color is not a simple gray
                * level in this case.)
                */
               expand_tRNS = 1;
               output_processing = PNG_CMAP_TRANS;
               background_index = 254;

               /* And set (overwrite) color-map entry 254 to the actual
                * background color at full precision.
                */
               png_create_colormap_entry(display, 254, back_r, back_g, back_b,
                   back_alpha, output_encoding);
            }

            else
               output_processing = PNG_CMAP_NONE;
         }
         break;

      case PNG_COLOR_TYPE_GRAY_ALPHA:
         /* 8-bit or 16-bit PNG with two channels - gray and alpha.  A minimum
          * of 65536 combinations.  If, however, the alpha channel is to be
          * removed there are only 256 possibilities if the background is gray.
          * (Otherwise there is a subset of the 65536 possibilities defined by
          * the triangle between black, white and the background color.)
          *
          * Reduce 16-bit files to 8-bit and sRGB encode the result.  No need to
          * worry about tRNS matching - tRNS is ignored if there is an alpha
          * channel.
          */
         data_encoding = P_sRGB;

         if ((output_format & PNG_FORMAT_FLAG_ALPHA) != 0)
         {
            if (PNG_GA_COLORMAP_ENTRIES > image->colormap_entries)
               png_error(png_ptr, "gray+alpha color-map: too few entries");

            cmap_entries = (unsigned int)make_ga_colormap(display);

            background_index = PNG_CMAP_GA_BACKGROUND;
            output_processing = PNG_CMAP_GA;
         }

         else /* alpha is removed */
         {
            /* Alpha must be removed as the PNG data is processed when the
             * background is a color because the G and A channels are
             * independent and the vector addition (non-parallel vectors) is a
             * 2-D problem.
             *
             * This can be reduced to the same algorithm as above by making a
             * colormap containing gray levels (for the opaque grays), a
             * background entry (for a transparent pixel) and a set of four six
             * level color values, one set for each intermediate alpha value.
             * See the comments in make_ga_colormap for how this works in the
             * per-pixel processing.
             *
             * If the background is gray, however, we only need a 256 entry gray
             * level color map.  It is sufficient to make the entry generated
             * for the background color be exactly the color specified.
             */
            if ((output_format & PNG_FORMAT_FLAG_COLOR) == 0 ||
               (back_r == back_g && back_g == back_b))
            {
               /* Background is gray; no special processing will be required. */
               png_color_16 c;
               png_uint_32 gray = back_g;

               if (PNG_GRAY_COLORMAP_ENTRIES > image->colormap_entries)
                  png_error(png_ptr, "gray-alpha color-map: too few entries");

               cmap_entries = (unsigned int)make_gray_colormap(display);

               if (output_encoding == P_LINEAR)
               {
                  gray = PNG_sRGB_FROM_LINEAR(gray * 255);

                  /* And make sure the corresponding palette entry matches. */
                  png_create_colormap_entry(display, gray, back_g, back_g,
                      back_g, 65535, P_LINEAR);
               }

               /* The background passed to libpng, however, must be the sRGB
                * value.
                */
               c.index = 0; /*unused*/
               c.gray = c.red = c.green = c.blue = (png_uint_16)gray;

               png_set_background_fixed(png_ptr, &c,
                   PNG_BACKGROUND_GAMMA_SCREEN, 0/*need_expand*/,
                   0/*gamma: not used*/);

               output_processing = PNG_CMAP_NONE;
            }

            else
            {
               png_uint_32 i, a;

               /* This is the same as png_make_ga_colormap, above, except that
                * the entries are all opaque.
                */
               if (PNG_GA_COLORMAP_ENTRIES > image->colormap_entries)
                  png_error(png_ptr, "ga-alpha color-map: too few entries");

               i = 0;
               while (i < 231)
               {
                  png_uint_32 gray = (i * 256 + 115) / 231;
                  png_create_colormap_entry(display, i++, gray, gray, gray,
                      255, P_sRGB);
               }

               /* NOTE: this preserves the full precision of the application
                * background color.
                */
               background_index = i;
               png_create_colormap_entry(display, i++, back_r, back_g, back_b,
#ifdef __COVERITY__
                   /* Coverity claims that output_encoding
                    * cannot be 2 (P_LINEAR) here.
                    */ 255U,
#else
                    output_encoding == P_LINEAR ? 65535U : 255U,
#endif
                    output_encoding);

               /* For non-opaque input composite on the sRGB background - this
                * requires inverting the encoding for each component.  The input
                * is still converted to the sRGB encoding because this is a
                * reasonable approximate to the logarithmic curve of human
                * visual sensitivity, at least over the narrow range which PNG
                * represents.  Consequently 'G' is always sRGB encoded, while
                * 'A' is linear.  We need the linear background colors.
                */
               if (output_encoding == P_sRGB) /* else already linear */
               {
                  /* This may produce a value not exactly matching the
                   * background, but that's ok because these numbers are only
                   * used when alpha != 0
                   */
                  back_r = png_sRGB_table[back_r];
                  back_g = png_sRGB_table[back_g];
                  back_b = png_sRGB_table[back_b];
               }

               for (a=1; a<5; ++a)
               {
                  unsigned int g;

                  /* PNG_sRGB_FROM_LINEAR expects a 16-bit linear value scaled
                   * by an 8-bit alpha value (0..255).
                   */
                  png_uint_32 alpha = 51 * a;
                  png_uint_32 back_rx = (255-alpha) * back_r;
                  png_uint_32 back_gx = (255-alpha) * back_g;
                  png_uint_32 back_bx = (255-alpha) * back_b;

                  for (g=0; g<6; ++g)
                  {
                     png_uint_32 gray = png_sRGB_table[g*51] * alpha;

                     png_create_colormap_entry(display, i++,
                         PNG_sRGB_FROM_LINEAR(gray + back_rx),
                         PNG_sRGB_FROM_LINEAR(gray + back_gx),
                         PNG_sRGB_FROM_LINEAR(gray + back_bx), 255, P_sRGB);
                  }
               }

               cmap_entries = i;
               output_processing = PNG_CMAP_GA;
            }
         }
         break;

      case PNG_COLOR_TYPE_RGB:
      case PNG_COLOR_TYPE_RGB_ALPHA:
         /* Exclude the case where the output is gray; we can always handle this
          * with the cases above.
          */
         if ((output_format & PNG_FORMAT_FLAG_COLOR) == 0)
         {
            /* The color-map will be grayscale, so we may as well convert the
             * input RGB values to a simple grayscale and use the grayscale
             * code above.
             *
             * NOTE: calling this apparently damages the recognition of the
             * transparent color in background color handling; call
             * png_set_tRNS_to_alpha before png_set_background_fixed.
             */
            png_set_rgb_to_gray_fixed(png_ptr, PNG_ERROR_ACTION_NONE, -1,
                -1);
            data_encoding = P_sRGB;

            /* The output will now be one or two 8-bit gray or gray+alpha
             * channels.  The more complex case arises when the input has alpha.
             */
            if ((png_ptr->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
               png_ptr->num_trans > 0) &&
               (output_format & PNG_FORMAT_FLAG_ALPHA) != 0)
            {
               /* Both input and output have an alpha channel, so no background
                * processing is required; just map the GA bytes to the right
                * color-map entry.
                */
               expand_tRNS = 1;

               if (PNG_GA_COLORMAP_ENTRIES > image->colormap_entries)
                  png_error(png_ptr, "rgb[ga] color-map: too few entries");

               cmap_entries = (unsigned int)make_ga_colormap(display);
               background_index = PNG_CMAP_GA_BACKGROUND;
               output_processing = PNG_CMAP_GA;
            }

            else
            {
               /* Either the input or the output has no alpha channel, so there
                * will be no non-opaque pixels in the color-map; it will just be
                * grayscale.
                */
               if (PNG_GRAY_COLORMAP_ENTRIES > image->colormap_entries)
                  png_error(png_ptr, "rgb[gray] color-map: too few entries");

               /* Ideally this code would use libpng to do the gamma correction,
                * but if an input alpha channel is to be removed we will hit the
                * libpng bug in gamma+compose+rgb-to-gray (the double gamma
                * correction bug).  Fix this by dropping the gamma correction in
                * this case and doing it in the palette; this will result in
                * duplicate palette entries, but that's better than the
                * alternative of double gamma correction.
                */
               if ((png_ptr->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
                  png_ptr->num_trans > 0) &&
                  png_gamma_not_sRGB(png_ptr->colorspace.gamma) != 0)
               {
                  cmap_entries = (unsigned int)make_gray_file_colormap(display);
                  data_encoding = P_FILE;
               }

               else
                  cmap_entries = (unsigned int)make_gray_colormap(display);

               /* But if the input has alpha or transparency it must be removed
                */
               if (png_ptr->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
                  png_ptr->num_trans > 0)
               {
                  png_color_16 c;
                  png_uint_32 gray = back_g;

                  /* We need to ensure that the application background exists in
                   * the colormap and that completely transparent pixels map to
                   * it.  Achieve this simply by ensuring that the entry
                   * selected for the background really is the background color.
                   */
                  if (data_encoding == P_FILE) /* from the fixup above */
                  {
                     /* The app supplied a gray which is in output_encoding, we
                      * need to convert it to a value of the input (P_FILE)
                      * encoding then set this palette entry to the required
                      * output encoding.
                      */
                     if (output_encoding == P_sRGB)
                        gray = png_sRGB_table[gray]; /* now P_LINEAR */

                     gray = PNG_DIV257(png_gamma_16bit_correct(gray,
                         png_ptr->colorspace.gamma)); /* now P_FILE */

                     /* And make sure the corresponding palette entry contains
                      * exactly the required sRGB value.
                      */
                     png_create_colormap_entry(display, gray, back_g, back_g,
                         back_g, 0/*unused*/, output_encoding);
                  }

                  else if (output_encoding == P_LINEAR)
                  {
                     gray = PNG_sRGB_FROM_LINEAR(gray * 255);

                     /* And make sure the corresponding palette entry matches.
                      */
                     png_create_colormap_entry(display, gray, back_g, back_g,
                        back_g, 0/*unused*/, P_LINEAR);
                  }

                  /* The background passed to libpng, however, must be the
                   * output (normally sRGB) value.
                   */
                  c.index = 0; /*unused*/
                  c.gray = c.red = c.green = c.blue = (png_uint_16)gray;

                  /* NOTE: the following is apparently a bug in libpng. Without
                   * it the transparent color recognition in
                   * png_set_background_fixed seems to go wrong.
                   */
                  expand_tRNS = 1;
                  png_set_background_fixed(png_ptr, &c,
                      PNG_BACKGROUND_GAMMA_SCREEN, 0/*need_expand*/,
                      0/*gamma: not used*/);
               }

               output_processing = PNG_CMAP_NONE;
            }
         }

         else /* output is color */
         {
            /* We could use png_quantize here so long as there is no transparent
             * color or alpha; png_quantize ignores alpha.  Easier overall just
             * to do it once and using PNG_DIV51 on the 6x6x6 reduced RGB cube.
             * Consequently we always want libpng to produce sRGB data.
             */
            data_encoding = P_sRGB;

            /* Is there any transparency or alpha? */
            if (png_ptr->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
               png_ptr->num_trans > 0)
            {
               /* Is there alpha in the output too?  If so all four channels are
                * processed into a special RGB cube with alpha support.
                */
               if ((output_format & PNG_FORMAT_FLAG_ALPHA) != 0)
               {
                  png_uint_32 r;

                  if (PNG_RGB_COLORMAP_ENTRIES+1+27 > image->colormap_entries)
                     png_error(png_ptr, "rgb+alpha color-map: too few entries");

                  cmap_entries = (unsigned int)make_rgb_colormap(display);

                  /* Add a transparent entry. */
                  png_create_colormap_entry(display, cmap_entries, 255, 255,
                      255, 0, P_sRGB);

                  /* This is stored as the background index for the processing
                   * algorithm.
                   */
                  background_index = cmap_entries++;

                  /* Add 27 r,g,b entries each with alpha 0.5. */
                  for (r=0; r<256; r = (r << 1) | 0x7f)
                  {
                     png_uint_32 g;

                     for (g=0; g<256; g = (g << 1) | 0x7f)
                     {
                        png_uint_32 b;

                        /* This generates components with the values 0, 127 and
                         * 255
                         */
                        for (b=0; b<256; b = (b << 1) | 0x7f)
                           png_create_colormap_entry(display, cmap_entries++,
                               r, g, b, 128, P_sRGB);
                     }
                  }

                  expand_tRNS = 1;
                  output_processing = PNG_CMAP_RGB_ALPHA;
               }

               else
               {
                  /* Alpha/transparency must be removed.  The background must
                   * exist in the color map (achieved by setting adding it after
                   * the 666 color-map).  If the standard processing code will
                   * pick up this entry automatically that's all that is
                   * required; libpng can be called to do the background
                   * processing.
                   */
                  unsigned int sample_size =
                     PNG_IMAGE_SAMPLE_SIZE(output_format);
                  png_uint_32 r, g, b; /* sRGB background */

                  if (PNG_RGB_COLORMAP_ENTRIES+1+27 > image->colormap_entries)
                     png_error(png_ptr, "rgb-alpha color-map: too few entries");

                  cmap_entries = (unsigned int)make_rgb_colormap(display);

                  png_create_colormap_entry(display, cmap_entries, back_r,
                      back_g, back_b, 0/*unused*/, output_encoding);

                  if (output_encoding == P_LINEAR)
                  {
                     r = PNG_sRGB_FROM_LINEAR(back_r * 255);
                     g = PNG_sRGB_FROM_LINEAR(back_g * 255);
                     b = PNG_sRGB_FROM_LINEAR(back_b * 255);
                  }

                  else
                  {
                     r = back_r;
                     g = back_g;
                     b = back_g;
                  }

                  /* Compare the newly-created color-map entry with the one the
                   * PNG_CMAP_RGB algorithm will use.  If the two entries don't
                   * match, add the new one and set this as the background
                   * index.
                   */
                  if (memcmp((png_const_bytep)display->colormap +
                      sample_size * cmap_entries,
                      (png_const_bytep)display->colormap +
                          sample_size * PNG_RGB_INDEX(r,g,b),
                     sample_size) != 0)
                  {
                     /* The background color must be added. */
                     background_index = cmap_entries++;

                     /* Add 27 r,g,b entries each with created by composing with
                      * the background at alpha 0.5.
                      */
                     for (r=0; r<256; r = (r << 1) | 0x7f)
                     {
                        for (g=0; g<256; g = (g << 1) | 0x7f)
                        {
                           /* This generates components with the values 0, 127
                            * and 255
                            */
                           for (b=0; b<256; b = (b << 1) | 0x7f)
                              png_create_colormap_entry(display, cmap_entries++,
                                  png_colormap_compose(display, r, P_sRGB, 128,
                                      back_r, output_encoding),
                                  png_colormap_compose(display, g, P_sRGB, 128,
                                      back_g, output_encoding),
                                  png_colormap_compose(display, b, P_sRGB, 128,
                                      back_b, output_encoding),
                                  0/*unused*/, output_encoding);
                        }
                     }

                     expand_tRNS = 1;
                     output_processing = PNG_CMAP_RGB_ALPHA;
                  }

                  else /* background color is in the standard color-map */
                  {
                     png_color_16 c;

                     c.index = 0; /*unused*/
                     c.red = (png_uint_16)back_r;
                     c.gray = c.green = (png_uint_16)back_g;
                     c.blue = (png_uint_16)back_b;

                     png_set_background_fixed(png_ptr, &c,
                         PNG_BACKGROUND_GAMMA_SCREEN, 0/*need_expand*/,
                         0/*gamma: not used*/);

                     output_processing = PNG_CMAP_RGB;
                  }
               }
            }

            else /* no alpha or transparency in the input */
            {
               /* Alpha in the output is irrelevant, simply map the opaque input
                * pixels to the 6x6x6 color-map.
                */
               if (PNG_RGB_COLORMAP_ENTRIES > image->colormap_entries)
                  png_error(png_ptr, "rgb color-map: too few entries");

               cmap_entries = (unsigned int)make_rgb_colormap(display);
               output_processing = PNG_CMAP_RGB;
            }
         }
         break;

      case PNG_COLOR_TYPE_PALETTE:
         /* It's already got a color-map.  It may be necessary to eliminate the
          * tRNS entries though.
          */
         {
            unsigned int num_trans = png_ptr->num_trans;
            png_const_bytep trans = num_trans > 0 ? png_ptr->trans_alpha : NULL;
            png_const_colorp colormap = png_ptr->palette;
            int do_background = trans != NULL &&
               (output_format & PNG_FORMAT_FLAG_ALPHA) == 0;
            unsigned int i;

            /* Just in case: */
            if (trans == NULL)
               num_trans = 0;

            output_processing = PNG_CMAP_NONE;
            data_encoding = P_FILE; /* Don't change from color-map indices */
            cmap_entries = (unsigned int)png_ptr->num_palette;
            if (cmap_entries > 256)
               cmap_entries = 256;

            if (cmap_entries > (unsigned int)image->colormap_entries)
               png_error(png_ptr, "palette color-map: too few entries");

            for (i=0; i < cmap_entries; ++i)
            {
               if (do_background != 0 && i < num_trans && trans[i] < 255)
               {
                  if (trans[i] == 0)
                     png_create_colormap_entry(display, i, back_r, back_g,
                         back_b, 0, output_encoding);

                  else
                  {
                     /* Must compose the PNG file color in the color-map entry
                      * on the sRGB color in 'back'.
                      */
                     png_create_colormap_entry(display, i,
                         png_colormap_compose(display, colormap[i].red,
                             P_FILE, trans[i], back_r, output_encoding),
                         png_colormap_compose(display, colormap[i].green,
                             P_FILE, trans[i], back_g, output_encoding),
                         png_colormap_compose(display, colormap[i].blue,
                             P_FILE, trans[i], back_b, output_encoding),
                         output_encoding == P_LINEAR ? trans[i] * 257U :
                             trans[i],
                         output_encoding);
                  }
               }

               else
                  png_create_colormap_entry(display, i, colormap[i].red,
                      colormap[i].green, colormap[i].blue,
                      i < num_trans ? trans[i] : 255U, P_FILE/*8-bit*/);
            }

            /* The PNG data may have indices packed in fewer than 8 bits, it
             * must be expanded if so.
             */
            if (png_ptr->bit_depth < 8)
               png_set_packing(png_ptr);
         }
         break;

      default:
         png_error(png_ptr, "invalid PNG color type");
         /*NOT REACHED*/
   }

   /* Now deal with the output processing */
   if (expand_tRNS != 0 && png_ptr->num_trans > 0 &&
       (png_ptr->color_type & PNG_COLOR_MASK_ALPHA) == 0)
      png_set_tRNS_to_alpha(png_ptr);

   switch (data_encoding)
   {
      case P_sRGB:
         /* Change to 8-bit sRGB */
         png_set_alpha_mode_fixed(png_ptr, PNG_ALPHA_PNG, PNG_GAMMA_sRGB);
         /* FALLTHROUGH */

      case P_FILE:
         if (png_ptr->bit_depth > 8)
            png_set_scale_16(png_ptr);
         break;

#ifdef __GNUC__
      default:
         png_error(png_ptr, "bad data option (internal error)");
#endif
   }

   if (cmap_entries > 256 || cmap_entries > image->colormap_entries)
      png_error(png_ptr, "color map overflow (BAD internal error)");

   image->colormap_entries = cmap_entries;

   /* Double check using the recorded background index */
   switch (output_processing)
   {
      case PNG_CMAP_NONE:
         if (background_index != PNG_CMAP_NONE_BACKGROUND)
            goto bad_background;
         break;

      case PNG_CMAP_GA:
         if (background_index != PNG_CMAP_GA_BACKGROUND)
            goto bad_background;
         break;

      case PNG_CMAP_TRANS:
         if (background_index >= cmap_entries ||
            background_index != PNG_CMAP_TRANS_BACKGROUND)
            goto bad_background;
         break;

      case PNG_CMAP_RGB:
         if (background_index != PNG_CMAP_RGB_BACKGROUND)
            goto bad_background;
         break;

      case PNG_CMAP_RGB_ALPHA:
         if (background_index != PNG_CMAP_RGB_ALPHA_BACKGROUND)
            goto bad_background;
         break;

      default:
         png_error(png_ptr, "bad processing option (internal error)");

      bad_background:
         png_error(png_ptr, "bad background index (internal error)");
   }

   display->colormap_processing = (int)output_processing;

   return 1/*ok*/;
}